

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifcls(bifcxdef *ctx,int argc)

{
  outflushn(0);
  oscls();
  return;
}

Assistant:

void bifcls(bifcxdef *ctx, int argc)
{
    /* this takes no arguments */
    bifcntargs(ctx, 0, argc);

    /* flush any pending output */
    tioflushn(ctx->bifcxtio, 0);
    
    /* clear the screen */
    oscls();
}